

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlNodeGetSpacePreserve(xmlNode *cur)

{
  int iVar1;
  xmlChar *str1;
  
  if ((cur != (xmlNode *)0x0) && (cur->type == XML_ELEMENT_NODE)) {
    do {
      str1 = xmlGetNsProp(cur,"space",(xmlChar *)"http://www.w3.org/XML/1998/namespace");
      if (str1 != (xmlChar *)0x0) {
        iVar1 = xmlStrEqual(str1,(xmlChar *)"preserve");
        if (iVar1 != 0) {
          iVar1 = 1;
LAB_00185930:
          (*xmlFree)(str1);
          return iVar1;
        }
        iVar1 = xmlStrEqual(str1,"default");
        if (iVar1 != 0) {
          iVar1 = 0;
          goto LAB_00185930;
        }
        (*xmlFree)(str1);
      }
      cur = cur->parent;
    } while (cur != (_xmlNode *)0x0);
  }
  return -1;
}

Assistant:

int
xmlNodeGetSpacePreserve(const xmlNode *cur) {
    xmlChar *space;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(-1);
    while (cur != NULL) {
	space = xmlGetNsProp(cur, BAD_CAST "space", XML_XML_NAMESPACE);
	if (space != NULL) {
	    if (xmlStrEqual(space, BAD_CAST "preserve")) {
		xmlFree(space);
		return(1);
	    }
	    if (xmlStrEqual(space, BAD_CAST "default")) {
		xmlFree(space);
		return(0);
	    }
	    xmlFree(space);
	}
	cur = cur->parent;
    }
    return(-1);
}